

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O2

bool __thiscall
axl::sys::NameableEventBase<axl::sl::False>::create
          (NameableEventBase<axl::sl::False> *this,StringRef *name)

{
  bool bVar1;
  int iVar2;
  CondMutexEventBase<axl::sl::False> *this_00;
  EVP_PKEY_CTX *src;
  SharedMemory sharedMemory;
  MutexAttr mutexAttr;
  CondAttr condAttr;
  
  close(this,(int)name);
  pthread_condattr_init((pthread_condattr_t *)&condAttr);
  pthread_mutexattr_init((pthread_mutexattr_t *)&mutexAttr);
  bVar1 = psx::CondAttr::setProcessShared(&condAttr,1);
  if (bVar1) {
    bVar1 = psx::MutexAttr::setProcessShared(&mutexAttr,1);
    if (bVar1) {
      sharedMemory.super_File.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
      m_h = (File)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
      iVar2 = io::psx::SharedMemory::open(&sharedMemory,(char *)name,0xc2,0x1b6);
      if ((char)iVar2 == '\0') {
LAB_001448aa:
        bVar1 = false;
      }
      else {
        bVar1 = io::psx::File::setSize(&sharedMemory.super_File,0x60);
        if (!bVar1) {
LAB_001448a2:
          io::psx::SharedMemory::unlink((char *)name);
          goto LAB_001448aa;
        }
        this_00 = (CondMutexEventBase<axl::sl::False> *)
                  io::psx::Mapping::map
                            (&this->m_mapping,(void *)0x0,0x60,3,1,
                             (int)sharedMemory.super_File.
                                  super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                  .m_h,0);
        this->m_event = this_00;
        if (this_00 == (CondMutexEventBase<axl::sl::False> *)0x0) goto LAB_001448a2;
        CondMutexEventBase<axl::sl::False>::CondMutexEventBase
                  (this_00,&condAttr.m_attr,&mutexAttr.m_attr);
        bVar1 = true;
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                  (&this->m_name,(EVP_PKEY_CTX *)name,src);
      }
      sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
                ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&sharedMemory);
      goto LAB_001448b6;
    }
  }
  bVar1 = false;
LAB_001448b6:
  pthread_mutexattr_destroy((pthread_mutexattr_t *)&mutexAttr);
  pthread_condattr_destroy((pthread_condattr_t *)&condAttr);
  return bVar1;
}

Assistant:

bool
	create(const sl::StringRef& name) {
		close();

		psx::CondAttr condAttr;
		psx::MutexAttr mutexAttr;

		bool result =
			condAttr.setProcessShared(PTHREAD_PROCESS_SHARED) &&
			mutexAttr.setProcessShared(PTHREAD_PROCESS_SHARED);

		if (!result)
			return false;

		io::psx::SharedMemory sharedMemory;
		result = sharedMemory.open(name, O_RDWR | O_CREAT | O_EXCL);
		if (!result)
			return false;

		result =
			sharedMemory.setSize(sizeof(EventImpl)) &&
			(m_event = (EventImpl*)m_mapping.map(
				NULL,
				sizeof(EventImpl),
				PROT_READ | PROT_WRITE,
				MAP_SHARED,
				sharedMemory
			));

		if (!result) {
			sharedMemory.unlink(name);
			return false;
		}

		new (m_event) EventImpl(condAttr, mutexAttr);
		m_name = name;
		return true;
	}